

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int32_t floatx80_to_int32_round_to_zero_mips(floatx80 a,float_status *status)

{
  unkuint10 Var1;
  _Bool _Var2;
  int32_t iVar3;
  uint64_t uVar4;
  ulong uVar5;
  byte bVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  int local_4c;
  int32_t z;
  uint64_t savedASig;
  uint64_t aSig;
  int32_t shiftCount;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var1 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var1;
  a_00.high = (short)(Var1 >> 0x40);
  _Var2 = floatx80_invalid_encoding(a_00);
  if (_Var2) {
    float_raise_mips('\x01',status);
    return -0x80000000;
  }
  a_01._10_6_ = 0;
  a_01.low = (long)Var1;
  a_01.high = (short)(Var1 >> 0x40);
  uVar4 = extractFloatx80Frac(a_01);
  a_02._10_6_ = 0;
  a_02.low = (long)Var1;
  a_02.high = (short)(Var1 >> 0x40);
  iVar3 = extractFloatx80Exp(a_02);
  a_03._10_6_ = 0;
  a_03.low = (long)Var1;
  a_03.high = (short)(Var1 >> 0x40);
  shiftCount._3_1_ = extractFloatx80Sign(a_03);
  if (iVar3 < 0x401f) {
    if (iVar3 < 0x3fff) {
      if ((iVar3 != 0) || (uVar4 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return 0;
    }
    bVar6 = 0x3e - (char)iVar3;
    uVar5 = uVar4 >> (bVar6 & 0x3f);
    local_4c = (int)uVar5;
    if (shiftCount._3_1_ != '\0') {
      local_4c = -local_4c;
    }
    if (local_4c < 0 == (bool)shiftCount._3_1_) {
      if (uVar5 << (bVar6 & 0x3f) != uVar4) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return local_4c;
    }
  }
  else if ((iVar3 == 0x7fff) && ((uVar4 & 0x7fffffffffffffff) != 0)) {
    shiftCount._3_1_ = '\0';
  }
  float_raise_mips('\x01',status);
  a_local._12_4_ = 0x7fffffff;
  if (shiftCount._3_1_ != '\0') {
    a_local._12_4_ = 0x80000000;
  }
  return a_local._12_4_;
}

Assistant:

int32_t floatx80_to_int32_round_to_zero(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig, savedASig;
    int32_t z;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1 << 31;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( 0x401E < aExp ) {
        if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) aSign = 0;
        goto invalid;
    }
    else if ( aExp < 0x3FFF ) {
        if (aExp || aSig) {
            status->float_exception_flags |= float_flag_inexact;
        }
        return 0;
    }
    shiftCount = 0x403E - aExp;
    savedASig = aSig;
    aSig >>= shiftCount;
    z = aSig;
    if ( aSign ) z = - z;
    if ( ( z < 0 ) ^ aSign ) {
 invalid:
        float_raise(float_flag_invalid, status);
        return aSign ? (int32_t) 0x80000000 : 0x7FFFFFFF;
    }
    if ( ( aSig<<shiftCount ) != savedASig ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}